

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Args args;
  Args AStack_108;
  
  Args::Args(&AStack_108,argc,argv);
  Args::run(&AStack_108);
  Args::~Args(&AStack_108);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    try {
        auto args = Args(argc, argv);
        args.run();
        return 0;
    } catch (const std::runtime_error& err) {
        std::cerr << err.what() << std::endl;
        return -1;
    }
}